

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_read_point(laszip_POINTER pointer)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  ulong uVar5;
  size_t in_RCX;
  void *in_RDX;
  short local_5a;
  laszip_point *point;
  I32 scanner_channel;
  I32 overlap_bit;
  I32 number_of_returns_increment;
  I32 return_number_increment;
  U8 flags_and_channel;
  U8 classification;
  U8 extended_returns;
  I16 scan_angle_remainder;
  laszip_dll_struct *laszip_dll;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else {
    uVar5 = LASreadPoint::read(*(LASreadPoint **)((long)pointer + 0x228),
                               (int)*(undefined8 *)((long)pointer + 0x210),in_RDX,in_RCX);
    if ((uVar5 & 1) == 0) {
      snprintf((char *)((long)pointer + 0x248),0x400,"reading point %lld of %lld total points",
               *(undefined8 *)((long)pointer + 0x1a0),*(undefined8 *)((long)pointer + 0x1a8));
      pointer_local._4_4_ = 1;
    }
    else {
      if ((*(byte *)((long)pointer + 0xa83) & 1) != 0) {
        sVar4 = *(short *)(*(long *)((long)pointer + 0x208) + (long)*(int *)((long)pointer + 0xa88))
        ;
        bVar1 = *(byte *)(*(long *)((long)pointer + 0x208) + (long)*(int *)((long)pointer + 0xa8c));
        cVar2 = *(char *)(*(long *)((long)pointer + 0x208) + (long)*(int *)((long)pointer + 0xa90));
        bVar3 = *(byte *)(*(long *)((long)pointer + 0x208) + (long)*(int *)((long)pointer + 0xa94));
        if (*(int *)((long)pointer + 0xa98) != -1) {
          *(undefined2 *)((long)pointer + 0x1de) =
               *(undefined2 *)
                (*(long *)((long)pointer + 0x208) + (long)*(int *)((long)pointer + 0xa98));
        }
        if ((float)(int)*(char *)((long)pointer + 0x1c0) / 0.006 < 0.0) {
          local_5a = (short)(int)((float)(int)*(char *)((long)pointer + 0x1c0) / 0.006 + -0.5);
        }
        else {
          local_5a = (short)(int)((float)(int)*(char *)((long)pointer + 0x1c0) / 0.006 + 0.5);
        }
        *(short *)((long)pointer + 0x1c4) = sVar4 + local_5a;
        *(byte *)((long)pointer + 0x1c8) =
             *(byte *)((long)pointer + 0x1c8) & 0xf0 |
             (bVar1 >> 4) + ((byte)*(undefined2 *)((long)pointer + 0x1be) & 7) & 0xf;
        *(byte *)((long)pointer + 0x1c8) =
             *(byte *)((long)pointer + 0x1c8) & 0xf |
             ((bVar1 & 0xf) + ((byte)(*(ushort *)((long)pointer + 0x1be) >> 3) & 7)) * '\x10';
        *(byte *)((long)pointer + 0x1c7) =
             cVar2 + ((byte)((ushort)*(undefined2 *)((long)pointer + 0x1be) >> 8) & 0x1f);
        *(byte *)((long)pointer + 0x1c6) =
             *(byte *)((long)pointer + 0x1c6) & 0xf3 | (bVar3 >> 1 & 3) << 2;
        *(byte *)((long)pointer + 0x1c6) =
             *(byte *)((long)pointer + 0x1c6) & 0xf |
             ((bVar3 & 1) << 3 | (byte)((ushort)*(undefined2 *)((long)pointer + 0x1be) >> 0xf) << 2
              | ((byte)((ushort)*(undefined2 *)((long)pointer + 0x1be) >> 0xe) & 1) << 1 |
             (byte)((ushort)*(undefined2 *)((long)pointer + 0x1be) >> 0xd) & 1) << 4;
      }
      *(long *)((long)pointer + 0x1a0) = *(long *)((long)pointer + 0x1a0) + 1;
      *(undefined1 *)((long)pointer + 0x248) = 0;
      pointer_local._4_4_ = 0;
    }
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_read_point(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    // read the point
    if (!laszip_dll->reader->read(laszip_dll->point_items))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reading point %lld of %lld total points", laszip_dll->p_count, laszip_dll->npoints);
      return 1;
    }

    // special recoding of points (in compatibility mode only)

    if (laszip_dll->compatibility_mode)
    {
      I16 scan_angle_remainder;
      U8 extended_returns;
      U8 classification;
      U8 flags_and_channel;
      I32 return_number_increment;
      I32 number_of_returns_increment;
      I32 overlap_bit;
      I32 scanner_channel;

      // instill extended attributes
      struct laszip_point* point = &laszip_dll->point;

      // get extended attributes from extra bytes
      scan_angle_remainder = *((I16*)(point->extra_bytes + laszip_dll->start_scan_angle));
      extended_returns = point->extra_bytes[laszip_dll->start_extended_returns];
      classification = point->extra_bytes[laszip_dll->start_classification];
      flags_and_channel = point->extra_bytes[laszip_dll->start_flags_and_channel];
      if (laszip_dll->start_NIR_band != -1)
      {
        point->rgb[3] = *((U16*)(point->extra_bytes + laszip_dll->start_NIR_band));
      }

      // decompose into individual attributes
      return_number_increment = (extended_returns >> 4) & 0x0F;
      number_of_returns_increment = extended_returns & 0x0F;
      scanner_channel = (flags_and_channel >> 1) & 0x03;
      overlap_bit = flags_and_channel & 0x01;

      // instill into point
      point->extended_scan_angle = scan_angle_remainder + I16_QUANTIZE(((F32)point->scan_angle_rank) / 0.006f);
      point->extended_return_number = return_number_increment + point->return_number;
      point->extended_number_of_returns = number_of_returns_increment + point->number_of_returns;
      point->extended_classification = classification + point->classification;
      point->extended_scanner_channel = scanner_channel;
      point->extended_classification_flags = (overlap_bit << 3) | ((point->withheld_flag) << 2) | ((point->keypoint_flag) << 1) | (point->synthetic_flag);
    }

    laszip_dll->p_count++;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_read_point");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}